

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void __thiscall
Fl_Paged_Device::draw_decorated_window
          (Fl_Paged_Device *this,Fl_Window *win,int x_offset,int y_offset,Fl_Surface_Device *toset)

{
  uint uVar1;
  uint X;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Fl_Display_Device *pFVar6;
  uchar *buf;
  bool local_81;
  uchar *local_80;
  uchar *bottom_image;
  uchar *right_image;
  uchar *left_image;
  uchar *top_image;
  int do_it;
  int bt;
  int bx;
  uint n;
  Window from;
  Window child_win;
  Window *children;
  Window parent;
  Window root;
  Fl_Surface_Device *toset_local;
  int y_offset_local;
  int x_offset_local;
  Fl_Window *win_local;
  Fl_Paged_Device *this_local;
  
  root = (Window)toset;
  toset_local._0_4_ = y_offset;
  toset_local._4_4_ = x_offset;
  _y_offset_local = win;
  win_local = (Fl_Window *)this;
  pFVar6 = Fl_Display_Device::display_device();
  (*(pFVar6->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])();
  (*(_y_offset_local->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])();
  Fl::check();
  Fl_Window::make_current(_y_offset_local);
  bt = 0;
  _bx = fl_window;
  iVar2 = XQueryTree(fl_display,fl_window,&parent,&children,&child_win);
  local_81 = false;
  if (iVar2 != 0) {
    iVar2 = XTranslateCoordinates
                      (fl_display,fl_window,children,0,0,&do_it,(long)&top_image + 4,&from);
    local_81 = iVar2 == 1;
  }
  top_image._0_4_ = (uint)local_81;
  if (bt != 0) {
    XFree(child_win);
  }
  if (((uint)top_image != 0) && ((Window *)parent == children)) {
    top_image._0_4_ = 0;
  }
  if ((uint)top_image == 0) {
    (**(code **)(*(long *)root + 0x18))();
    (*(this->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[0xe])
              (this,_y_offset_local,(ulong)toset_local._4_4_,(ulong)(uint)toset_local);
  }
  else {
    fl_window = (Window)children;
    right_image = (uchar *)0x0;
    bottom_image = (uchar *)0x0;
    local_80 = (uchar *)0x0;
    iVar2 = Fl_Widget::w((Fl_Widget *)_y_offset_local);
    buf = fl_read_image((uchar *)0x0,0,0,-(iVar2 + do_it * 2),top_image._4_4_,0);
    iVar2 = top_image._4_4_;
    if (do_it != 0) {
      iVar5 = -do_it;
      iVar3 = Fl_Widget::h((Fl_Widget *)_y_offset_local);
      right_image = fl_read_image((uchar *)0x0,0,iVar2,iVar5,iVar3 + do_it,0);
      iVar3 = Fl_Widget::w((Fl_Widget *)_y_offset_local);
      iVar5 = top_image._4_4_;
      iVar3 = iVar3 + do_it;
      iVar2 = -do_it;
      iVar4 = Fl_Widget::h((Fl_Widget *)_y_offset_local);
      bottom_image = fl_read_image((uchar *)0x0,iVar3,iVar5,iVar2,iVar4 + do_it,0);
      iVar2 = top_image._4_4_;
      iVar5 = Fl_Widget::h((Fl_Widget *)_y_offset_local);
      iVar3 = Fl_Widget::w((Fl_Widget *)_y_offset_local);
      local_80 = fl_read_image((uchar *)0x0,0,iVar2 + iVar5,-(iVar3 + do_it * 2),do_it,0);
    }
    fl_window = _bx;
    (**(code **)(*(long *)root + 0x18))();
    X = toset_local._4_4_;
    uVar1 = (uint)toset_local;
    if (buf != (uchar *)0x0) {
      iVar2 = Fl_Widget::w((Fl_Widget *)_y_offset_local);
      fl_draw_image(buf,X,uVar1,iVar2 + do_it * 2,top_image._4_4_,3,0);
      if (buf != (uchar *)0x0) {
        operator_delete__(buf);
      }
    }
    uVar1 = toset_local._4_4_;
    iVar2 = do_it;
    if (do_it != 0) {
      if (right_image != (uchar *)0x0) {
        iVar5 = (uint)toset_local + top_image._4_4_;
        iVar3 = Fl_Widget::h((Fl_Widget *)_y_offset_local);
        fl_draw_image(right_image,uVar1,iVar5,iVar2,iVar3 + do_it,3,0);
      }
      uVar1 = toset_local._4_4_;
      if (bottom_image != (uchar *)0x0) {
        iVar5 = Fl_Widget::w((Fl_Widget *)_y_offset_local);
        iVar2 = do_it;
        iVar5 = uVar1 + iVar5 + do_it;
        iVar3 = (uint)toset_local + top_image._4_4_;
        iVar4 = Fl_Widget::h((Fl_Widget *)_y_offset_local);
        fl_draw_image(bottom_image,iVar5,iVar3,iVar2,iVar4 + do_it,3,0);
      }
      uVar1 = toset_local._4_4_;
      if (local_80 != (uchar *)0x0) {
        iVar2 = (uint)toset_local + top_image._4_4_;
        iVar5 = Fl_Widget::h((Fl_Widget *)_y_offset_local);
        iVar3 = Fl_Widget::w((Fl_Widget *)_y_offset_local);
        fl_draw_image(local_80,uVar1,iVar2 + iVar5,iVar3 + do_it * 2,do_it,3,0);
      }
      if ((right_image != (uchar *)0x0) && (right_image != (uchar *)0x0)) {
        operator_delete__(right_image);
      }
      if ((bottom_image != (uchar *)0x0) && (bottom_image != (uchar *)0x0)) {
        operator_delete__(bottom_image);
      }
      if ((local_80 != (uchar *)0x0) && (local_80 != (uchar *)0x0)) {
        operator_delete__(local_80);
      }
    }
    (*(this->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[0xe])
              (this,_y_offset_local,(ulong)(toset_local._4_4_ + do_it),
               (ulong)((uint)toset_local + top_image._4_4_));
  }
  return;
}

Assistant:

void Fl_Paged_Device::draw_decorated_window(Fl_Window *win, int x_offset, int y_offset, Fl_Surface_Device *toset)
{
  Fl_Display_Device::display_device()->set_current();
  win->show();
  Fl::check();
  win->make_current();
  Window root, parent, *children, child_win, from;
  unsigned n = 0;
  int bx, bt, do_it;
  from = fl_window;
  do_it = (XQueryTree(fl_display, fl_window, &root, &parent, &children, &n) != 0 && 
	   XTranslateCoordinates(fl_display, fl_window, parent, 0, 0, &bx, &bt, &child_win) == True);
  if (n) XFree(children);
  // hack to bypass STR #2648: when compiz is used, root and parent are the same window 
  // and I don't know where to find the window decoration
  if (do_it && root == parent) do_it = 0; 
  if (!do_it) {
    toset->set_current();
    this->print_widget(win, x_offset, y_offset);
    return;
  }
  fl_window = parent;
  uchar *top_image = 0, *left_image = 0, *right_image = 0, *bottom_image = 0;
  top_image = fl_read_image(NULL, 0, 0, - (win->w() + 2 * bx), bt);
  if (bx) {
    left_image = fl_read_image(NULL, 0, bt, -bx, win->h() + bx);
    right_image = fl_read_image(NULL, win->w() + bx, bt, -bx, win->h() + bx);
    bottom_image = fl_read_image(NULL, 0, bt + win->h(), -(win->w() + 2*bx), bx);
  }
  fl_window = from;
  toset->set_current();
  if (top_image) {
    fl_draw_image(top_image, x_offset, y_offset, win->w() + 2 * bx, bt, 3);
    delete[] top_image;
  }
  if (bx) {
    if (left_image) fl_draw_image(left_image, x_offset, y_offset + bt, bx, win->h() + bx, 3);
    if (right_image) fl_draw_image(right_image, x_offset + win->w() + bx, y_offset + bt, bx, win->h() + bx, 3);
    if (bottom_image) fl_draw_image(bottom_image, x_offset, y_offset + bt + win->h(), win->w() + 2*bx, bx, 3);
    if (left_image) delete[] left_image;
    if (right_image) delete[] right_image;
    if (bottom_image) delete[] bottom_image;
  }
  this->print_widget( win, x_offset + bx, y_offset + bt );
}